

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int __thiscall
CVmObjString::get_prop
          (CVmObjString *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  vm_datatype_t vVar2;
  vm_obj_id_t in_ECX;
  vm_obj_id_t *in_RDX;
  undefined2 in_SI;
  vm_val_t *in_RDI;
  vm_val_t *in_R8;
  char *in_R9;
  CVmObject *unaff_retaddr;
  vm_val_t self_val;
  vm_obj_id_t *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffec;
  vm_obj_id_t self_00;
  vm_val_t *retval_00;
  undefined4 in_stack_fffffffffffffffc;
  vm_prop_id_t prop_00;
  
  prop_00 = (vm_prop_id_t)((uint)in_stack_fffffffffffffffc >> 0x10);
  self_00 = CONCAT22(in_SI,in_stack_ffffffffffffffec);
  retval_00 = in_RDI;
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb8,in_ECX);
  iVar1 = const_get_prop((vm_val_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,in_R9,
                         in_stack_ffffffffffffffc6,in_stack_ffffffffffffffb8,&in_RDI->typ);
  if (iVar1 == 0) {
    iVar1 = CVmObject::get_prop(unaff_retaddr,prop_00,retval_00,self_00,in_RDX,
                                (uint *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  }
  else {
    vVar2 = CVmMetaclass::get_class_obj
                      ((CVmMetaclass *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)
                      );
    in_R8->typ = vVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CVmObjString::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                           vm_obj_id_t self, vm_obj_id_t *source_obj,
                           uint *argc)
{
    vm_val_t self_val;
    
    /* use the constant evaluator */
    self_val.set_obj(self);
    if (const_get_prop(vmg_ retval, &self_val, ext_, prop, source_obj, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }

    /* inherit default handling from the base object class */
    return CVmObject::get_prop(vmg_ prop, retval, self, source_obj, argc);
}